

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol.cpp
# Opt level: O2

void MOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,bool is_velocity)

{
  int *piVar1;
  int i;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  undefined4 in_register_00000034;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int k;
  long lVar13;
  long lVar14;
  long lVar15;
  Box local_4fc;
  FabArray<amrex::FArrayBox> *local_4e0;
  undefined8 local_4d8;
  Array4<const_double> v;
  Array4<const_double> u;
  Box tmpbox;
  Array4<const_double> w;
  FArrayBox tmpfab;
  Array4<const_double> local_340;
  Elixir eli;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fy;
  Array4<double> fx;
  MFIter mfi;
  MFItInfo local_104;
  Array4<const_double> wc;
  Array4<const_double> vc;
  Array4<const_double> uc;
  
  local_4d8 = CONCAT44(in_register_00000034,aofs_comp);
  local_4e0 = &state->super_FabArray<amrex::FArrayBox>;
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < state_comp + ncomp) {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa4,(char *)0x0);
  }
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < (int)local_4d8 + ncomp) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa5,(char *)0x0);
  }
  iVar6 = edge_comp + ncomp;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar6) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa6,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar6) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa7,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar6) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa8,(char *)0x0);
  }
  iVar6 = fluxes_comp + ncomp;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar6) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa9,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar6) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xaa,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar6) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xab,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xac,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xad,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xae,(char *)0x0);
  }
  if ((!known_edgestate) &&
     ((((FabArray<amrex::FArrayBox> *)&local_4e0->super_FabArrayBase)->super_FabArrayBase).n_grow.
      vect[0] < (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] + 2)) {
    amrex::Assert_host("state.nGrow() >= xedge.nGrow()+2",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xb3,(char *)0x0);
  }
  local_104.num_streams = amrex::Gpu::Device::max_gpu_streams;
  local_104.do_tiling = true;
  local_104.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_104.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_104.tilesize.vect[2] = DAT_007d7ef0;
  local_104.dynamic = true;
  local_104.device_sync = true;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)aofs,&local_104);
  uVar2 = 0;
  if (0 < ncomp) {
    uVar2 = (ulong)(uint)ncomp;
  }
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_4fc,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&xed,&xedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&yed,&yedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&zed,&zedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&uc,&ucorr->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&vc,&vcorr->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&wc,&wcorr->super_FabArray<amrex::FArrayBox>,&mfi);
    if (!known_edgestate) {
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&tmpfab,local_4e0,&mfi,state_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&u,&umac->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&v,&vmac->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&w,&wmac->super_FabArray<amrex::FArrayBox>,&mfi);
      ComputeEdgeState(&local_4fc,&xed,&yed,&zed,(Array4<const_double> *)&tmpfab,ncomp,&u,&v,&w,
                       &geom->domain,bcs,d_bcrec_ptr,is_velocity);
    }
    tmpbox.bigend.vect[2] = local_4fc.bigend.vect[2];
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if ((local_4fc.btype.itype >> ((uint)lVar3 & 0x1f) & 1) == 0) {
        piVar1 = tmpbox.bigend.vect + lVar3;
        *piVar1 = *piVar1 + 1;
      }
    }
    tmpbox.btype.itype = 7;
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)&tmpfab.super_BaseFab<double>,&tmpbox,ncomp * 3,true,false,(Arena *)0x0)
    ;
    amrex::BaseFab<double>::elixir<double,_0>(&eli,&tmpfab.super_BaseFab<double>);
    u.begin.x = tmpfab.super_BaseFab<double>.domain.smallend.vect[0];
    u.begin.y = tmpfab.super_BaseFab<double>.domain.smallend.vect[1];
    u.p = tmpfab.super_BaseFab<double>.dptr;
    u.jstride = ((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] -
                (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
    u.kstride = (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
                (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[1]) * u.jstride;
    u.nstride = (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
                (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[2]) * u.kstride;
    u.begin.z = tmpfab.super_BaseFab<double>.domain.smallend.vect[2];
    u.end._0_8_ = (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
                  (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
    u.end.z = (int)((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
    u.ncomp = tmpfab.super_BaseFab<double>.nvar;
    v.p = xed.p;
    v.jstride = xed.jstride;
    v.kstride = xed.kstride;
    v.nstride = xed.nstride;
    v.begin.z = xed.begin.z;
    v.begin.x = xed.begin.x;
    v.begin.y = xed.begin.y;
    v.end.z = xed.end.z;
    v.end.x = xed.end.x;
    v.end.y = xed.end.y;
    v.ncomp = xed.ncomp;
    w.p = yed.p;
    w.jstride = yed.jstride;
    w.kstride = yed.kstride;
    w.nstride = yed.nstride;
    w.begin.z = yed.begin.z;
    w.begin.x = yed.begin.x;
    w.begin.y = yed.begin.y;
    w.end.z = yed.end.z;
    w.end.x = yed.end.x;
    w.end.y = yed.end.y;
    w.ncomp = yed.ncomp;
    local_340.p = zed.p;
    local_340.jstride = zed.jstride;
    local_340.kstride = zed.kstride;
    local_340.nstride = zed.nstride;
    local_340.begin.z = zed.begin.z;
    local_340.begin.x = zed.begin.x;
    local_340.begin.y = zed.begin.y;
    local_340.end.z = zed.end.z;
    local_340.end.x = zed.end.x;
    local_340.end.y = zed.end.y;
    local_340.ncomp = zed.ncomp;
    HydroUtils::ComputeFluxes(&local_4fc,&fx,&fy,&fz,&uc,&vc,&wc,&v,&w,&local_340,geom,ncomp,true);
    v.p = fx.p;
    v.jstride = fx.jstride;
    v.kstride = fx.kstride;
    v.nstride = fx.nstride;
    v.begin.z = fx.begin.z;
    v.begin.x = fx.begin.x;
    v.begin.y = fx.begin.y;
    v.end.z = fx.end.z;
    v.end.x = fx.end.x;
    v.end.y = fx.end.y;
    v.ncomp = fx.ncomp;
    w.p = fy.p;
    w.jstride = fy.jstride;
    w.kstride = fy.kstride;
    w.nstride = fy.nstride;
    w.begin.z = fy.begin.z;
    w.begin.x = fy.begin.x;
    w.begin.y = fy.begin.y;
    w.end.z = fy.end.z;
    w.end.x = fy.end.x;
    w.end.y = fy.end.y;
    w.ncomp = fy.ncomp;
    local_340.p = fz.p;
    local_340.jstride = fz.jstride;
    local_340.kstride = fz.kstride;
    local_340.nstride = fz.nstride;
    local_340.begin.z = fz.begin.z;
    local_340.begin.x = fz.begin.x;
    local_340.begin.y = fz.begin.y;
    local_340.end.z = fz.end.z;
    local_340.end.x = fz.end.x;
    local_340.end.y = fz.end.y;
    local_340.ncomp = fz.ncomp;
    HydroUtils::ComputeDivergence
              (&local_4fc,(Array4<double> *)&u,&v,&w,&local_340,ncomp,geom,-1.0,true);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&v,&aofs->super_FabArray<amrex::FArrayBox>,&mfi,(int)local_4d8);
    lVar3 = (long)local_4fc.smallend.vect[1];
    lVar8 = (long)local_4fc.smallend.vect[2];
    lVar14 = (lVar3 - v.begin.y) * v.jstride * 8 + (lVar8 - v.begin.z) * v.kstride * 8 +
             (long)local_4fc.smallend.vect[0] * 8 + (long)v.begin.x * -8 + (long)v.p;
    lVar9 = (lVar3 - u.begin.y) * u.jstride * 8 + (lVar8 - u.begin.z) * u.kstride * 8 +
            (long)local_4fc.smallend.vect[0] * 8 + (long)u.begin.x * -8 + (long)u.p;
    for (uVar5 = 0; lVar4 = lVar14, lVar11 = lVar9, lVar13 = lVar8, uVar5 != uVar2;
        uVar5 = uVar5 + 1) {
      for (; lVar7 = lVar4, lVar12 = lVar3, lVar15 = lVar11, lVar13 <= local_4fc.bigend.vect[2];
          lVar13 = lVar13 + 1) {
        for (; lVar12 <= local_4fc.bigend.vect[1]; lVar12 = lVar12 + 1) {
          if (local_4fc.smallend.vect[0] <= local_4fc.bigend.vect[0]) {
            lVar10 = 0;
            do {
              *(double *)(lVar7 + lVar10 * 8) =
                   *(double *)(lVar7 + lVar10 * 8) - *(double *)(lVar15 + lVar10 * 8);
              lVar10 = lVar10 + 1;
            } while ((local_4fc.bigend.vect[0] - local_4fc.smallend.vect[0]) + 1 != (int)lVar10);
          }
          lVar7 = lVar7 + v.jstride * 8;
          lVar15 = lVar15 + u.jstride * 8;
        }
        lVar4 = lVar4 + v.kstride * 8;
        lVar11 = lVar11 + u.kstride * 8;
      }
      lVar14 = lVar14 + v.nstride * 8;
      lVar9 = lVar9 + u.nstride * 8;
    }
    amrex::Gpu::Device::streamSynchronize();
    amrex::Gpu::Elixir::~Elixir(&eli);
    amrex::BaseFab<double>::~BaseFab(&tmpfab.super_BaseFab<double>);
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                       MultiFab const& state, int state_comp,
                       AMREX_D_DECL( MultiFab const& umac,
                                     MultiFab const& vmac,
                                     MultiFab const& wmac),
                       AMREX_D_DECL( MultiFab const& ucorr,
                                     MultiFab const& vcorr,
                                     MultiFab const& wcorr),
                       AMREX_D_DECL( MultiFab& xedge,
                                     MultiFab& yedge,
                                     MultiFab& zedge),
                       int  edge_comp,
                       bool known_edgestate,
                       AMREX_D_DECL( MultiFab& xfluxes,
                                     MultiFab& yfluxes,
                                     MultiFab& zfluxes),
                       int fluxes_comp,
                       Vector<BCRec> const& bcs,
                       BCRec  const* d_bcrec_ptr,
                       Geometry const&  geom,
                       const bool is_velocity)

{
    BL_PROFILE("MOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););

    // To compute edge states, need at least 2 more ghost cells in state than in
    //  xedge
    if ( !known_edgestate ) {
        AMREX_ALWAYS_ASSERT(state.nGrow() >= xedge.nGrow()+2);
    }

    Box  const& domain = geom.Domain();

    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                      Array4<Real const> vc = vcorr.const_array(mfi);,
                      Array4<Real const> wc = wcorr.const_array(mfi););

        // Compute edge state if needed
        if (!known_edgestate)
        {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                          Array4<Real const> v = vmac.const_array(mfi);,
                          Array4<Real const> w = wmac.const_array(mfi););

            ComputeEdgeState( bx, AMREX_D_DECL( xed, yed, zed ), q, ncomp,
                              AMREX_D_DECL( u, v, w ), domain, bcs, d_bcrec_ptr,
                              is_velocity);

        }

        // Temporary divergence
        Box tmpbox = amrex::surroundingNodes(bx);
        int tmpcomp = ncomp*AMREX_SPACEDIM;
        FArrayBox tmpfab(tmpbox, tmpcomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> divtmp_arr = tmpfab.array();

        // Compute fluxes
        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL(fx,fy,fz),
                                   AMREX_D_DECL(uc,vc,wc),
                                   AMREX_D_DECL(xed,yed,zed),
                                   geom, ncomp, fluxes_are_area_weighted );

        // Compute divergence
        Real mult = -1.0;
        HydroUtils::ComputeDivergence( bx, divtmp_arr,
                                       AMREX_D_DECL(fx,fy,fz),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);

        // Sum contribution to sync aofs
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) += -divtmp_arr( i, j, k, n ); });

        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }
}